

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.cpp
# Opt level: O0

void __thiscall
sc_core::sc_signal<bool,_(sc_core::sc_writer_policy)0>::do_update
          (sc_signal<bool,_(sc_core::sc_writer_policy)0> *this)

{
  long in_RDI;
  sc_reset *unaff_retaddr;
  sc_event *event_p;
  sc_event *in_stack_ffffffffffffffd8;
  sc_signal_t<bool,_(sc_core::sc_writer_policy)0> *in_stack_ffffffffffffffe0;
  sc_signal_channel *this_00;
  
  sc_signal_t<bool,_(sc_core::sc_writer_policy)0>::do_update(in_stack_ffffffffffffffe0);
  if (*(long *)(in_RDI + 0xd0) != 0) {
    sc_reset::notify_processes(unaff_retaddr);
  }
  if ((*(byte *)(in_RDI + 0xb8) & 1) == 0) {
    this_00 = *(sc_signal_channel **)(in_RDI + 0xc0);
  }
  else {
    this_00 = *(sc_signal_channel **)(in_RDI + 200);
  }
  sc_signal_channel::notify_next_delta(this_00,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void
sc_signal<bool,POL>::do_update()
{
    // order of execution below is important, the notify_processes() call
    // must come after the update of m_cur_val for things to work properly!
    base_type::do_update();
    if ( m_reset_p ) m_reset_p->notify_processes();

    sc_event* event_p = this->m_cur_val ? m_posedge_event_p : m_negedge_event_p;
    sc_signal_channel::notify_next_delta( event_p );
}